

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand2.cpp
# Opt level: O0

void __thiscall Printer::~Printer(Printer *this)

{
  ostream *poVar1;
  Printer *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Final count is ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->count_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_waitable_timer(&this->timer2_);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_waitable_timer(&this->timer1_);
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::
  ~strand(&this->strand_);
  return;
}

Assistant:

~Printer() {
    std::cout << "Final count is " << count_ << std::endl;
  }